

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O0

void KConfigExport::dump_header(MetaConfiguration *conf,string *filename,string *exportHeader)

{
  bool bVar1;
  QLoggingCategory *pQVar2;
  char *category;
  QDebug *debug;
  ostream *poVar3;
  long lVar4;
  size_type sVar5;
  element_type *top;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  string export_name;
  ofstream header;
  QMessageLogger local_50;
  QDebug local_30 [15];
  bool local_21;
  string *psStack_20;
  bool qt_category_enabled;
  string *exportHeader_local;
  string *filename_local;
  MetaConfiguration *conf_local;
  
  psStack_20 = exportHeader;
  exportHeader_local = filename;
  filename_local = (string *)conf;
  pQVar2 = dumpKConfigSource();
  local_21 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_21 != false) {
    pQVar2 = dumpKConfigSource();
    category = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger(&local_50,(char *)0x0,0,(char *)0x0,category);
    QMessageLogger::debug();
    debug = QDebug::operator<<(local_30,"Starting to dump the source file into");
    operator<<(debug,exportHeader_local);
    QDebug::~QDebug(local_30);
    local_21 = false;
  }
  std::ofstream::ofstream((ostream *)(export_name.field_2._M_local_buf + 8),exportHeader_local,0x10)
  ;
  poVar3 = std::operator<<((ostream *)(export_name.field_2._M_local_buf + 8),"// clang-format off");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  begin_header_guards((ofstream *)(export_name.field_2._M_local_buf + 8),exportHeader_local);
  std::ostream::operator<<
            ((ostream *)(export_name.field_2._M_local_buf + 8),
             std::endl<char,std::char_traits<char>>);
  dump_notice((ofstream *)(export_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_280);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    poVar3 = std::operator<<((ostream *)(export_name.field_2._M_local_buf + 8),"#include <");
    poVar3 = std::operator<<(poVar3,(string *)psStack_20);
    poVar3 = std::operator<<(poVar3,"_export.h>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    capitalize(&local_2c0,psStack_20,-1);
    std::operator+(&local_2a0,&local_2c0,"_EXPORT");
    std::__cxx11::string::operator=((string *)local_280,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  poVar3 = std::operator<<((ostream *)(export_name.field_2._M_local_buf + 8),"#include <functional>"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)(export_name.field_2._M_local_buf + 8),"#include <QObject>");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<
            ((ostream *)(export_name.field_2._M_local_buf + 8),
             std::endl<char,std::char_traits<char>>);
  dump_headers((ofstream *)(export_name.field_2._M_local_buf + 8),
               (vector<MetaInclude,_std::allocator<MetaInclude>_> *)filename_local);
  sVar5 = std::vector<MetaInclude,_std::allocator<MetaInclude>_>::size
                    ((vector<MetaInclude,_std::allocator<MetaInclude>_> *)filename_local);
  if (sVar5 != 0) {
    std::ostream::operator<<
              ((ostream *)(export_name.field_2._M_local_buf + 8),
               std::endl<char,std::char_traits<char>>);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    poVar3 = std::operator<<((ostream *)(export_name.field_2._M_local_buf + 8),"namespace ");
    poVar3 = std::operator<<(poVar3,(string *)&filename_local[1]._M_string_length);
    poVar3 = std::operator<<(poVar3," {");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  sVar5 = std::vector<MetaInclude,_std::allocator<MetaInclude>_>::size
                    ((vector<MetaInclude,_std::allocator<MetaInclude>_> *)filename_local);
  if (sVar5 != 0) {
    std::ostream::operator<<
              ((ostream *)(export_name.field_2._M_local_buf + 8),
               std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)((filename_local->field_2)._M_local_buf + 8));
  if (bVar1) {
    top = std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&filename_local->field_2 + 8));
    anon_unknown.dwarf_51ec9::dump_header_class
              (top,(ofstream *)(export_name.field_2._M_local_buf + 8),(string *)local_280);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    poVar3 = std::operator<<((ostream *)(export_name.field_2._M_local_buf + 8),"}");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<
            ((ostream *)(export_name.field_2._M_local_buf + 8),
             std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)(export_name.field_2._M_local_buf + 8),"// clang-format on");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_280);
  std::ofstream::~ofstream((void *)((long)&export_name.field_2 + 8));
  return;
}

Assistant:

void dump_header(
    const MetaConfiguration &conf,
    const std::string &filename,
    const std::string &exportHeader)
{
  qCDebug(dumpKConfigSource) << "Starting to dump the source file into" << filename;

  std::ofstream header(filename);
  // disable clang format for this, it's an automated file.

  header << "// clang-format off" << std::endl;

  begin_header_guards(header, filename);
  header << std::endl;

  dump_notice(header);

  std::string export_name;
  if (exportHeader.size() != 0) {
    header << "#include <" << exportHeader << "_export.h>" << std::endl;
    export_name = capitalize(exportHeader, -1) + "_EXPORT";
  }

  header << "#include <functional>" << std::endl;
  header << "#include <QObject>" << std::endl;

  header << std::endl;
  dump_headers(header, conf.includes);

  if (conf.includes.size()) {
    header << std::endl;
  }

  if (conf.conf_namespace.size()) {
    header << "namespace " << conf.conf_namespace << " {" << std::endl;
  }

  if (conf.includes.size()) {
    header << std::endl;
  }

  if (conf.top_level_class) {
    dump_header_class(conf.top_level_class.get(), header, export_name);
  }

  if (conf.conf_namespace.size()) {
    header << "}" << std::endl;
  }

  header << std::endl;
  header << "// clang-format on" << std::endl;
}